

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

bool make_old_bright_enough(Am_Style *old,float *y,float *i,float *q)

{
  bool local_37;
  bool local_36;
  float local_34;
  float fStack_30;
  bool saturated;
  float blue;
  float green;
  float red;
  float *q_local;
  float *i_local;
  float *y_local;
  Am_Style *old_local;
  
  _green = q;
  q_local = i;
  i_local = y;
  y_local = (float *)old;
  Am_Style::Get_Values(old,&blue,&stack0xffffffffffffffd0,&local_34);
  if (((blue != 1.0) || (NAN(blue))) && ((local_34 != 1.0 || (NAN(local_34))))) {
    local_36 = false;
    if ((fStack_30 != 1.0) || (NAN(fStack_30))) goto LAB_0034edea;
  }
  local_37 = true;
  if ((blue != 0.0) || (NAN(blue))) {
    local_37 = true;
    if ((local_34 != 0.0) || (NAN(local_34))) {
      local_37 = fStack_30 == 0.0;
    }
  }
  local_36 = local_37;
LAB_0034edea:
  *i_local = local_34 * 0.11 + blue * 0.3 + fStack_30 * 0.59;
  *q_local = local_34 * -0.32 + blue * 0.6 + fStack_30 * -0.28;
  *_green = local_34 * 0.31 + blue * 0.21 + fStack_30 * -0.52;
  if (*i_local < 0.4) {
    *i_local = 0.4;
  }
  return local_36;
}

Assistant:

bool
make_old_bright_enough(const Am_Style &old, float &y, float &i, float &q)
{
  float red, green, blue;
  old.Get_Values(red, green, blue);
  //if one of the "pure" colors, then adjust highlight color so will show up
  bool saturated = ((red == 1.0f || blue == 1.0f || green == 1.0f) &&
                    (red == 0.0f || blue == 0.0f || green == 0.0f));
  //  std::cout << "   rgb=" << red << "," << green << "," << blue <<std::endl <<std::flush;
  y = (red * 0.3f) + (green * 0.59f) + (blue * 0.11f);
  i = (red * 0.6f) + (green * -0.28f) + (blue * -0.32f);
  q = (red * 0.21f) + (green * -0.52f) + (blue * 0.31f);
  if (y < MIN_ACCEPTABLE_BRIGHTNESS) {
    //    std::cout << "   old Y " << y << " too dark\n" <<std::flush;
    y = static_cast<float>(MIN_ACCEPTABLE_BRIGHTNESS);
  }
  return saturated;
}